

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O2

int ProjectBissectionInParametricDomain<pzgeom::TPZQuadraticTrig>
              (TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  double *pdVar1;
  bool bVar2;
  int c;
  long lVar3;
  int iVar4;
  TPZVec<double> *this;
  int sideto;
  double dVar5;
  double dVar6;
  TPZVec<double> InnPt;
  TPZVec<double> OutPt;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  
  (*qsiInDomain->_vptr_TPZVec[3])(qsiInDomain,2);
  bVar2 = pztopology::TPZTriangle::IsInParametricDomain(qsi,0.0);
  if (bVar2) {
    iVar4 = 6;
    TPZVec<double>::operator=(qsiInDomain,qsi);
  }
  else {
    TPZVec<double>::TPZVec(&OutPt,qsi);
    TPZVec<double>::TPZVec(&InnPt,2);
    pztopology::TPZTriangle::CenterPoint(6,&InnPt);
    dVar5 = 0.0;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      dVar5 = dVar5 + (InnPt.fStore[lVar3] - OutPt.fStore[lVar3]) *
                      (InnPt.fStore[lVar3] - OutPt.fStore[lVar3]);
    }
    if (dVar5 < 0.0) goto LAB_00f05485;
    dVar6 = SQRT(dVar5);
    while (1e-10 < dVar6) {
      pdVar1 = qsiInDomain->fStore;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        pdVar1[lVar3] = (InnPt.fStore[lVar3] + OutPt.fStore[lVar3]) * 0.5;
      }
      bVar2 = pztopology::TPZTriangle::IsInParametricDomain(qsiInDomain,0.0);
      this = &OutPt;
      if (bVar2) {
        this = &InnPt;
      }
      TPZVec<double>::operator=(this,qsiInDomain);
      dVar5 = 0.0;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        dVar5 = dVar5 + (InnPt.fStore[lVar3] - OutPt.fStore[lVar3]) *
                        (InnPt.fStore[lVar3] - OutPt.fStore[lVar3]);
      }
      dVar6 = SQRT(dVar5);
      if (dVar5 < 0.0) {
LAB_00f05485:
        dVar6 = sqrt(dVar5);
      }
    }
    TPZManVector<double,_3>::TPZManVector(&pt1,2);
    TPZManVector<double,_3>::TPZManVector(&pt2,2);
    sideto = 0;
    iVar4 = -1;
    do {
      if (sideto == 6) break;
      pztopology::TPZTriangle::SideToSideTransform(&T1,6,sideto);
      TPZTransform<double>::Apply(&T1,qsiInDomain,&pt1.super_TPZVec<double>);
      pztopology::TPZTriangle::SideToSideTransform(&T2,sideto,6);
      TPZTransform<double>::Apply(&T2,&pt1.super_TPZVec<double>,&pt2.super_TPZVec<double>);
      dVar5 = 0.0;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        dVar6 = qsiInDomain->fStore[lVar3] - pt2.super_TPZVec<double>.fStore[lVar3];
        dVar5 = dVar5 + dVar6 * dVar6;
      }
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      if (dVar5 < 1e-10) {
        TPZVec<double>::operator=(qsiInDomain,&pt2.super_TPZVec<double>);
        iVar4 = sideto;
      }
      TPZTransform<double>::~TPZTransform(&T2);
      TPZTransform<double>::~TPZTransform(&T1);
      sideto = sideto + 1;
    } while (1e-10 <= dVar5);
    TPZManVector<double,_3>::~TPZManVector(&pt2);
    TPZManVector<double,_3>::~TPZManVector(&pt1);
    TPZVec<double>::~TPZVec(&InnPt);
    TPZVec<double>::~TPZVec(&OutPt);
  }
  return iVar4;
}

Assistant:

int ProjectBissectionInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    const int dim = Topology::Dimension;
    
    qsiInDomain.Resize(dim);
    
    if(Topology::IsInParametricDomain(qsi,0.))///it is already in the domain
    {
        qsiInDomain = qsi;
        return nsides-1;
    }
    
    REAL tol = 1.e-10;
    
    ///first, will be made a project to center direction
    TPZVec<REAL> OutPt(qsi), InnPt(dim);
    Topology::CenterPoint(nsides-1,InnPt);
    
    REAL dist = 0.;
    for(int c = 0; c < dim; c++)
    {
        dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
    }
    dist = sqrt(dist);
    
    while(dist > tol)
    {
        for(int c = 0; c < dim; c++)
        {
            qsiInDomain[c] = (InnPt[c] + OutPt[c])/2.;
        }
        if(Topology::IsInParametricDomain(qsiInDomain,0.))
        {
            InnPt = qsiInDomain;
        }
        else
        {
            OutPt = qsiInDomain;
        }
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
        }
        dist = sqrt(dist);
    }
    
    ///found in witch side the projection belongs
    int winnerSide = -1;
    TPZManVector<REAL,3> pt1(dim), pt2(dim);
    for(int is = 0; is < nsides-1; is++)
    {
        ///Go orthogonally from \f$ NSides-1 \f$ to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        T1.Apply(qsiInDomain,pt1);
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare ptInDomain to transformed point
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (qsiInDomain[c]-pt2[c]) * (qsiInDomain[c]-pt2[c]);
        }//i
        dist = sqrt(dist);
        
        ///Closest side
        if(dist < tol)
        {
            winnerSide = is;
            qsiInDomain = pt2;
            break;
        }
    }//for is
    
    return winnerSide;
    
}